

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChildKiller_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::KillChildren::
act<hiberlite::AVisitor<hiberlite::KillChildren>,std::pair<int,double>,hiberlite::stl_stream_adapter<std::pair<int,double>,std::set<std::pair<int,double>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>>>
          (KillChildren *this,AVisitor<hiberlite::KillChildren> *av,
          collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
          *nvp)

{
  undefined8 _value;
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  *this_00;
  reference pvVar1;
  pair<int,_double> *ppVar2;
  reference __x;
  allocator local_241;
  string local_240 [32];
  string local_220 [32];
  undefined1 local_200 [95];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [8];
  sql_nvp<std::pair<int,_double>_> el;
  pair<int,_double> *entry;
  size_t i;
  undefined1 local_e0 [24];
  vector<long_long,_std::allocator<long_long>_> children;
  undefined1 local_70 [8];
  string tab;
  string local_40 [32];
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  *local_20;
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  *nvp_local;
  AVisitor<hiberlite::KillChildren> *av_local;
  KillChildren *this_local;
  
  local_20 = nvp;
  nvp_local = (collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
               *)av;
  av_local = (AVisitor<hiberlite::KillChildren> *)this;
  std::__cxx11::string::string(local_40,(string *)nvp);
  AVisitor<hiberlite::KillChildren>::diveTable(av,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  AVisitor<hiberlite::KillChildren>::getScope
            ((Scope *)&children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
             (AVisitor<hiberlite::KillChildren> *)nvp_local);
  Scope::table_abi_cxx11_((Scope *)local_70);
  Scope::~Scope((Scope *)&children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  AVisitor<hiberlite::KillChildren>::getConnection((AVisitor<hiberlite::KillChildren> *)local_e0);
  std::__cxx11::string::string((string *)&i,(string *)local_70);
  pvVar1 = std::stack<long_long,_std::deque<long_long,_std::allocator<long_long>_>_>::top
                     (&this->rowId);
  Database::dbSelectChildIds
            ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10),
             (shared_connection *)local_e0,(string *)&i,*pvVar1);
  std::__cxx11::string::~string((string *)&i);
  shared_res<hiberlite::autoclosed_con>::~shared_res
            ((shared_res<hiberlite::autoclosed_con> *)local_e0);
  entry = (pair<int,_double> *)0x0;
  while( true ) {
    ppVar2 = (pair<int,_double> *)
             std::vector<long_long,_std::allocator<long_long>_>::size
                       ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10));
    if (ppVar2 <= entry) break;
    construct<hiberlite::AVisitor<hiberlite::KillChildren>,std::pair<int,double>>
              ((AVisitor<hiberlite::KillChildren> *)nvp_local,(pair<int,_double> **)&el.field_0x40,0
              );
    __x = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                    ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10),
                     (size_type)entry);
    std::stack<long_long,_std::deque<long_long,_std::allocator<long_long>_>_>::push
              (&this->rowId,__x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"item",&local_179);
    _value = el._64_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"",&local_1a1);
    sql_nvp<std::pair<int,_double>_>::sql_nvp
              ((sql_nvp<std::pair<int,_double>_> *)local_158,(string *)local_178,
               (pair<int,_double> *)_value,(string *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    this_00 = nvp_local;
    sql_nvp<std::pair<int,_double>_>::sql_nvp
              ((sql_nvp<std::pair<int,_double>_> *)(local_200 + 0x10),
               (sql_nvp<std::pair<int,_double>_> *)local_158);
    AVisitor<hiberlite::KillChildren>::operator&
              ((AVisitor<hiberlite::KillChildren> *)this_00,
               (sql_nvp<std::pair<int,_double>_> *)(local_200 + 0x10));
    sql_nvp<std::pair<int,_double>_>::~sql_nvp
              ((sql_nvp<std::pair<int,_double>_> *)(local_200 + 0x10));
    std::stack<long_long,_std::deque<long_long,_std::allocator<long_long>_>_>::pop(&this->rowId);
    destroy<hiberlite::KillChildren,std::pair<int,double>>(this,(pair<int,_double> *)el._64_8_,0);
    sql_nvp<std::pair<int,_double>_>::~sql_nvp((sql_nvp<std::pair<int,_double>_> *)local_158);
    entry = (pair<int,_double> *)((long)&entry->first + 1);
  }
  AVisitor<hiberlite::KillChildren>::pop((AVisitor<hiberlite::KillChildren> *)nvp_local);
  AVisitor<hiberlite::KillChildren>::getConnection((AVisitor<hiberlite::KillChildren> *)local_200);
  std::__cxx11::string::string(local_220,(string *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"hiberlite_parent_id",&local_241);
  pvVar1 = std::stack<long_long,_std::deque<long_long,_std::allocator<long_long>_>_>::top
                     (&this->rowId);
  Database::dbDeleteRows<long_long>
            ((shared_connection *)local_200,(string *)local_220,(string *)local_240,*pvVar1);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_220);
  shared_res<hiberlite::autoclosed_con>::~shared_res
            ((shared_res<hiberlite::autoclosed_con> *)local_200);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10));
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void KillChildren::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, rowId.top());
		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));
				rowId.push(children[i]);
					sql_nvp<E> el("item",*entry);
					av & el;
				rowId.pop();
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();

	Database::dbDeleteRows(av.getConnection(),tab,HIBERLITE_PARENTID_COLUMN,rowId.top());
}